

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O1

point3f tinyusdz::value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::point3f,double,float,3ul>
                  (matrix4d *m,point3f *v)

{
  size_t j;
  long lVar1;
  double dVar2;
  point3f ret;
  
  j = 0;
  do {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (double)*(float *)((long)&v->x + lVar1) * *(double *)((long)m + lVar1 * 8);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0xc);
    (&ret.x)[j] = (float)dVar2;
    j = j + 1;
    m = (matrix4d *)((long)m + 8);
  } while (j != 3);
  return ret;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}